

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseClassMember(Parser *this)

{
  Token *t;
  int iVar1;
  bool bVar2;
  Node *pNVar3;
  
  iVar1 = this->pos;
  t = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start + iVar1;
  if (t->type == TK_CONSTRUCTOR) {
    this->tok = t;
    this->pos = iVar1 + 1;
    pNVar3 = createAccessConstructorNode(this,t);
    return pNVar3;
  }
  if (t->type == TK_BASE) {
    this->tok = t;
    this->pos = iVar1 + 1;
    pNVar3 = createBaseNode(this,t);
    return pNVar3;
  }
  bVar2 = expect(this,TK_IDENTIFIER);
  if (bVar2) {
    pNVar3 = createIdentifierNode(this,this->tok);
    return pNVar3;
  }
  return (Node *)0x0;
}

Assistant:

Node * parseClassMember()
  {
    if (accept(TK_BASE))
      return createBaseNode(*tok);

    if (accept(TK_CONSTRUCTOR))
      return createAccessConstructorNode(*tok);

    if (expect(TK_IDENTIFIER))
      return createIdentifierNode(*tok);

    return nullptr;
  }